

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

void Vector3OrthoNormalize(Vector3 *v1,Vector3 *v2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar3 = v1->z * v1->z + v1->x * v1->x + v1->y * v1->y;
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  fVar3 = (float)(-(uint)(fVar3 == 0.0) & 0x3f800000 | ~-(uint)(fVar3 == 0.0) & (uint)(1.0 / fVar3))
  ;
  fVar6 = v1->x * fVar3;
  v1->x = fVar6;
  fVar4 = v1->y * fVar3;
  v1->y = fVar4;
  fVar3 = fVar3 * v1->z;
  v1->z = fVar3;
  fVar7 = fVar4 * v2->z - v2->y * fVar3;
  fVar5 = fVar3 * v2->x - v2->z * fVar6;
  fVar4 = fVar6 * v2->y - fVar4 * v2->x;
  fVar3 = fVar4 * fVar4 + fVar7 * fVar7 + fVar5 * fVar5;
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  fVar2 = (float)(-(uint)(fVar3 == 0.0) & 0x3f800000 | ~-(uint)(fVar3 == 0.0) & (uint)(1.0 / fVar3))
  ;
  fVar3 = v1->z;
  fVar6 = v1->x;
  fVar1 = v1->y;
  v2->x = fVar5 * fVar2 * fVar3 - fVar1 * fVar4 * fVar2;
  v2->y = fVar4 * fVar2 * fVar6 - fVar3 * fVar7 * fVar2;
  v2->z = fVar7 * fVar2 * fVar1 - fVar5 * fVar2 * fVar6;
  return;
}

Assistant:

RMAPI void Vector3OrthoNormalize(Vector3 *v1, Vector3 *v2)
{
    float length = 0.0f;
    float ilength = 0.0f;

    // Vector3Normalize(*v1);
    Vector3 v = *v1;
    length = sqrtf(v.x*v.x + v.y*v.y + v.z*v.z);
    if (length == 0.0f) length = 1.0f;
    ilength = 1.0f/length;
    v1->x *= ilength;
    v1->y *= ilength;
    v1->z *= ilength;

    // Vector3CrossProduct(*v1, *v2)
    Vector3 vn1 = { v1->y*v2->z - v1->z*v2->y, v1->z*v2->x - v1->x*v2->z, v1->x*v2->y - v1->y*v2->x };

    // Vector3Normalize(vn1);
    v = vn1;
    length = sqrtf(v.x*v.x + v.y*v.y + v.z*v.z);
    if (length == 0.0f) length = 1.0f;
    ilength = 1.0f/length;
    vn1.x *= ilength;
    vn1.y *= ilength;
    vn1.z *= ilength;

    // Vector3CrossProduct(vn1, *v1)
    Vector3 vn2 = { vn1.y*v1->z - vn1.z*v1->y, vn1.z*v1->x - vn1.x*v1->z, vn1.x*v1->y - vn1.y*v1->x };

    *v2 = vn2;
}